

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O2

void diy::
     reduce<void(*)(Block*,diy::ReduceProxy_const&,diy::RegularMergePartners_const&),diy::RegularMergePartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,RegularMergePartners *partners,
               _func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr **reduce,
               ReduceNeverSkip *skip)

{
  bool bVar1;
  IncomingQueues *this;
  uint uVar2;
  int iVar3;
  int round_;
  ulong uVar4;
  shared_ptr<diy::spd::logger> log;
  vector<int,_std::allocator<int>_> incoming_gids;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  int local_17c;
  _func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr **local_178;
  Assigner *local_170;
  ulong local_168;
  Skip local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip> local_130;
  ReductionFunctor<Block,_diy::RegularMergePartners> local_118;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  local_178 = reduce;
  local_170 = assigner;
  std::make_shared<diy::spd::logger>();
  local_17c = master->expected_;
  uVar4 = 0;
  while( true ) {
    round_ = (int)uVar4;
    if ((ulong)((long)(partners->super_RegularPartners).kvs_.
                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(partners->super_RegularPartners).kvs_.
                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
    local_198 = (code *)0x0;
    pcStack_190 = (code *)0x0;
    local_1a8._M_unused._M_object =
         (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0;
    local_1a8._8_8_ = 0;
    if (*local_178 != (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0) {
      pcStack_190 = std::
                    _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                    ::_M_invoke;
      local_198 = std::
                  _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                  ::_M_manager;
      local_1a8._M_unused._0_8_ = (undefined8)*local_178;
    }
    detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
              (&local_118,round_,(Callback *)&local_1a8,partners,local_170);
    local_130.round = round_;
    local_130.partners = partners;
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::RegularMergePartners,diy::detail::ReduceNeverSkip>,void>
              ((function<bool(int,diy::Master_const&)> *)&local_160,&local_130);
    Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
              (master,&local_118,&local_160);
    std::_Function_base::~_Function_base(&local_160.super__Function_base);
    detail::ReductionFunctor<Block,_diy::RegularMergePartners>::~ReductionFunctor(&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
    Master::execute(master);
    iVar3 = 0;
    local_168 = uVar4;
    for (uVar2 = 0;
        uVar2 < (uint)((ulong)((long)(master->blocks_).elements_.
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(master->blocks_).elements_.
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3); uVar2 = uVar2 + 1) {
      bVar1 = RegularMergePartners::active
                        (partners,round_ + 1U,
                         (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar2],master);
      if (bVar1) {
        local_118.reduce.super__Function_base._M_functor._8_8_ = 0;
        local_118._0_8_ = 0;
        local_118.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
        RegularPartners::fill
                  (&partners->super_RegularPartners,(int)local_168,
                   (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar2],
                   (vector<int,_std::allocator<int>_> *)&local_118);
        uVar4 = (long)local_118.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                local_118._0_8_;
        this = Master::incoming(master,(master->gids_).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(int)uVar2]);
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear(this);
        iVar3 = iVar3 + (int)(uVar4 >> 2);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
      }
    }
    master->expected_ = iVar3;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_80 = std::
               _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
               ::_M_manager;
    local_78 = 0;
    uStack_70 = 0;
    local_60 = std::
               _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
               ::_M_manager;
    local_58 = 0;
    uStack_50 = 0;
    local_40 = std::
               _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
               ::_M_manager;
    Master::flush(master,false,(MemoryManagement *)&local_98);
    MemoryManagement::~MemoryManagement((MemoryManagement *)&local_98);
    uVar4 = (ulong)(round_ + 1U);
  }
  local_198 = (code *)0x0;
  pcStack_190 = (code *)0x0;
  local_1a8._M_unused._M_object =
       (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0;
  local_1a8._8_8_ = 0;
  if (*local_178 != (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0) {
    pcStack_190 = std::
                  _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                  ::_M_invoke;
    local_198 = std::
                _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                ::_M_manager;
    local_1a8._M_unused._0_8_ = (undefined8)*local_178;
  }
  detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
            (&local_118,round_,(Callback *)&local_1a8,partners,local_170);
  local_130.round = round_;
  local_130.partners = partners;
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<diy::RegularMergePartners,diy::detail::ReduceNeverSkip>,void>
            ((function<bool(int,diy::Master_const&)> *)&local_160,&local_130);
  Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
            (master,&local_118,&local_160);
  std::_Function_base::~_Function_base(&local_160.super__Function_base);
  detail::ReductionFunctor<Block,_diy::RegularMergePartners>::~ReductionFunctor(&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  master->expected_ = local_17c;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}